

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O0

string * __thiscall
de::FilePath::getFileExtension_abi_cxx11_(string *__return_storage_ptr__,FilePath *this)

{
  allocator<char> local_41;
  long local_40;
  size_t dotPos;
  string baseName;
  FilePath *this_local;
  
  baseName.field_2._8_8_ = this;
  getBaseName_abi_cxx11_((string *)&dotPos,this);
  local_40 = std::__cxx11::string::find_last_of((char)&dotPos,0x2e);
  if (local_40 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_41);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&dotPos);
  }
  std::__cxx11::string::~string((string *)&dotPos);
  return __return_storage_ptr__;
}

Assistant:

std::string FilePath::getFileExtension (void) const
{
	std::string baseName = getBaseName();
	size_t dotPos = baseName.find_last_of('.');
	if (dotPos == std::string::npos)
		return std::string("");
	else
		return baseName.substr(dotPos+1);
}